

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O3

int mbedtls_pem_read_buffer
              (mbedtls_pem_context *ctx,char *header,char *footer,uchar *data,uchar *pwd,
              size_t pwdlen,size_t *use_len)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  uchar *puVar11;
  long *plVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uchar pem_iv [16];
  size_t local_60;
  uchar local_58 [24];
  size_t local_40;
  uchar *local_38;
  
  if (ctx == (mbedtls_pem_context *)0x0) {
    return -0x1480;
  }
  local_40 = pwdlen;
  local_38 = pwd;
  puVar5 = (uchar *)strstr((char *)data,header);
  if (puVar5 == (uchar *)0x0) {
    return -0x1080;
  }
  puVar6 = (uchar *)strstr((char *)data,footer);
  if (puVar6 <= puVar5) {
    return -0x1080;
  }
  sVar7 = strlen(header);
  lVar2 = (puVar5[sVar7] == ' ') + sVar7;
  if (puVar5[(ulong)(puVar5[(puVar5[sVar7] == ' ') + sVar7] == '\r') + lVar2] != '\n') {
    return -0x1080;
  }
  lVar2 = (ulong)(puVar5[(puVar5[sVar7] == ' ') + sVar7] == '\r') + lVar2;
  puVar11 = puVar5 + lVar2 + 1;
  sVar7 = strlen(footer);
  lVar3 = (puVar6[sVar7] == ' ') + sVar7;
  *use_len = (size_t)(puVar6 + (((ulong)(puVar6[(ulong)(puVar6[(puVar6[sVar7] == ' ') + sVar7] ==
                                                       '\r') + lVar3] == '\n') +
                                (ulong)(puVar6[(puVar6[sVar7] == ' ') + sVar7] == '\r') + lVar3) -
                               (long)data));
  bVar1 = true;
  uVar10 = 0;
  if ((0x15 < (long)puVar6 - (long)puVar11) &&
     (auVar19[0] = -(puVar5[lVar2 + 7] == 'y'), auVar19[1] = -(puVar5[lVar2 + 8] == 'p'),
     auVar19[2] = -(puVar5[lVar2 + 9] == 'e'), auVar19[3] = -(puVar5[lVar2 + 10] == ':'),
     auVar19[4] = -(puVar5[lVar2 + 0xb] == ' '), auVar19[5] = -(puVar5[lVar2 + 0xc] == '4'),
     auVar19[6] = -(puVar5[lVar2 + 0xd] == ','), auVar19[7] = -(puVar5[lVar2 + 0xe] == 'E'),
     auVar19[8] = -(puVar5[lVar2 + 0xf] == 'N'), auVar19[9] = -(puVar5[lVar2 + 0x10] == 'C'),
     auVar19[10] = -(puVar5[lVar2 + 0x11] == 'R'), auVar19[0xb] = -(puVar5[lVar2 + 0x12] == 'Y'),
     auVar19[0xc] = -(puVar5[lVar2 + 0x13] == 'P'), auVar19[0xd] = -(puVar5[lVar2 + 0x14] == 'T'),
     auVar19[0xe] = -(puVar5[lVar2 + 0x15] == 'E'), auVar19[0xf] = -(puVar5[lVar2 + 0x16] == 'D'),
     auVar13[0] = -(*puVar11 == 'P'), auVar13[1] = -(puVar5[lVar2 + 2] == 'r'),
     auVar13[2] = -(puVar5[lVar2 + 3] == 'o'), auVar13[3] = -(puVar5[lVar2 + 4] == 'c'),
     auVar13[4] = -(puVar5[lVar2 + 5] == '-'), auVar13[5] = -(puVar5[lVar2 + 6] == 'T'),
     auVar13[6] = -(puVar5[lVar2 + 7] == 'y'), auVar13[7] = -(puVar5[lVar2 + 8] == 'p'),
     auVar13[8] = -(puVar5[lVar2 + 9] == 'e'), auVar13[9] = -(puVar5[lVar2 + 10] == ':'),
     auVar13[10] = -(puVar5[lVar2 + 0xb] == ' '), auVar13[0xb] = -(puVar5[lVar2 + 0xc] == '4'),
     auVar13[0xc] = -(puVar5[lVar2 + 0xd] == ','), auVar13[0xd] = -(puVar5[lVar2 + 0xe] == 'E'),
     auVar13[0xe] = -(puVar5[lVar2 + 0xf] == 'N'), auVar13[0xf] = -(puVar5[lVar2 + 0x10] == 'C'),
     auVar13 = auVar13 & auVar19, uVar10 = 0,
     (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff)) {
    lVar3 = lVar2 + 0x17;
    if (puVar5[lVar2 + 0x17] == '\r') {
      lVar3 = lVar2 + 0x18;
    }
    puVar11 = puVar5 + lVar3;
    if (puVar5[(ulong)(puVar5[lVar2 + 0x17] == '\r') + 0x17 + lVar2] != '\n') {
      return -0x1100;
    }
    plVar12 = (long *)(puVar11 + 1);
    if ((long)puVar6 - (long)plVar12 < 0x17) {
      if (0x11 < (long)puVar6 - (long)plVar12) goto LAB_00115f04;
LAB_00115f33:
      uVar10 = 0;
      bVar1 = true;
    }
    else {
      auVar20[0] = -(puVar11[8] == 'o');
      auVar20[1] = -(puVar11[9] == ':');
      auVar20[2] = -(puVar11[10] == ' ');
      auVar20[3] = -(puVar11[0xb] == 'D');
      auVar20[4] = -(puVar11[0xc] == 'E');
      auVar20[5] = -(puVar11[0xd] == 'S');
      auVar20[6] = -(puVar11[0xe] == '-');
      auVar20[7] = -(puVar11[0xf] == 'E');
      auVar20[8] = -(puVar11[0x10] == 'D');
      auVar20[9] = -(puVar11[0x11] == 'E');
      auVar20[10] = -(puVar11[0x12] == '3');
      auVar20[0xb] = -(puVar11[0x13] == '-');
      auVar20[0xc] = -(puVar11[0x14] == 'C');
      auVar20[0xd] = -(puVar11[0x15] == 'B');
      auVar20[0xe] = -(puVar11[0x16] == 'C');
      auVar20[0xf] = -(puVar11[0x17] == ',');
      auVar14[0] = -((char)*plVar12 == 'D');
      auVar14[1] = -(puVar11[2] == 'E');
      auVar14[2] = -(puVar11[3] == 'K');
      auVar14[3] = -(puVar11[4] == '-');
      auVar14[4] = -(puVar11[5] == 'I');
      auVar14[5] = -(puVar11[6] == 'n');
      auVar14[6] = -(puVar11[7] == 'f');
      auVar14[7] = -(puVar11[8] == 'o');
      auVar14[8] = -(puVar11[9] == ':');
      auVar14[9] = -(puVar11[10] == ' ');
      auVar14[10] = -(puVar11[0xb] == 'D');
      auVar14[0xb] = -(puVar11[0xc] == 'E');
      auVar14[0xc] = -(puVar11[0xd] == 'S');
      auVar14[0xd] = -(puVar11[0xe] == '-');
      auVar14[0xe] = -(puVar11[0xf] == 'E');
      auVar14[0xf] = -(puVar11[0x10] == 'D');
      auVar14 = auVar14 & auVar20;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
        if ((long)puVar6 - (long)(puVar11 + 0x18) < 0x10) {
          return -0x1200;
        }
        iVar4 = pem_get_iv(puVar11 + 0x18,local_58,8);
        if (iVar4 != 0) {
          return -0x1200;
        }
        plVar12 = (long *)(puVar11 + 0x28);
        uVar10 = 0x25;
      }
      else {
LAB_00115f04:
        auVar15[0] = -((char)*plVar12 == 'D');
        auVar15[1] = -(puVar11[2] == 'E');
        auVar15[2] = -(puVar11[3] == 'K');
        auVar15[3] = -(puVar11[4] == '-');
        auVar15[4] = -(puVar11[5] == 'I');
        auVar15[5] = -(puVar11[6] == 'n');
        auVar15[6] = -(puVar11[7] == 'f');
        auVar15[7] = -(puVar11[8] == 'o');
        auVar15[8] = -(puVar11[9] == ':');
        auVar15[9] = -(puVar11[10] == ' ');
        auVar15[10] = -(puVar11[0xb] == 'D');
        auVar15[0xb] = -(puVar11[0xc] == 'E');
        auVar15[0xc] = -(puVar11[0xd] == 'S');
        auVar15[0xd] = -(puVar11[0xe] == '-');
        auVar15[0xe] = -(puVar11[0xf] == 'C');
        auVar15[0xf] = -(puVar11[0x10] == 'B');
        auVar21[0] = -((char)*(undefined2 *)(puVar11 + 0x11) == 'C');
        auVar21[1] = -((char)((ushort)*(undefined2 *)(puVar11 + 0x11) >> 8) == ',');
        auVar21[2] = 0xff;
        auVar21[3] = 0xff;
        auVar21[4] = 0xff;
        auVar21[5] = 0xff;
        auVar21[6] = 0xff;
        auVar21[7] = 0xff;
        auVar21[8] = 0xff;
        auVar21[9] = 0xff;
        auVar21[10] = 0xff;
        auVar21[0xb] = 0xff;
        auVar21[0xc] = 0xff;
        auVar21[0xd] = 0xff;
        auVar21[0xe] = 0xff;
        auVar21[0xf] = 0xff;
        auVar21 = auVar21 & auVar15;
        if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00115f33;
        if ((long)puVar6 - (long)(puVar11 + 0x13) < 0x10) {
          return -0x1200;
        }
        iVar4 = pem_get_iv(puVar11 + 0x13,local_58,8);
        if (iVar4 != 0) {
          return -0x1200;
        }
        plVar12 = (long *)(puVar11 + 0x23);
        uVar10 = 0x21;
      }
      bVar1 = false;
    }
    if (((long)puVar6 - (long)plVar12 < 0xe) ||
       (*(long *)((long)plVar12 + 6) != 0x2d534541203a6f66 || *plVar12 != 0x6f666e492d4b4544)) {
      if (bVar1) {
        return -0x1280;
      }
    }
    else {
      if ((ulong)((long)puVar6 - (long)plVar12) < 0x16) {
        return -0x1280;
      }
      auVar22[0] = -(*(char *)((long)plVar12 + 6) == 'f');
      auVar22[1] = -(*(char *)((long)plVar12 + 7) == 'o');
      auVar22[2] = -((char)plVar12[1] == ':');
      auVar22[3] = -(*(char *)((long)plVar12 + 9) == ' ');
      auVar22[4] = -(*(char *)((long)plVar12 + 10) == 'A');
      auVar22[5] = -(*(char *)((long)plVar12 + 0xb) == 'E');
      auVar22[6] = -(*(char *)((long)plVar12 + 0xc) == 'S');
      auVar22[7] = -(*(char *)((long)plVar12 + 0xd) == '-');
      auVar22[8] = -(*(char *)((long)plVar12 + 0xe) == '1');
      auVar22[9] = -(*(char *)((long)plVar12 + 0xf) == '2');
      auVar22[10] = -((char)plVar12[2] == '8');
      auVar22[0xb] = -(*(char *)((long)plVar12 + 0x11) == '-');
      auVar22[0xc] = -(*(char *)((long)plVar12 + 0x12) == 'C');
      auVar22[0xd] = -(*(char *)((long)plVar12 + 0x13) == 'B');
      auVar22[0xe] = -(*(char *)((long)plVar12 + 0x14) == 'C');
      auVar22[0xf] = -(*(char *)((long)plVar12 + 0x15) == ',');
      auVar16[0] = -((char)*plVar12 == 'D');
      auVar16[1] = -(*(char *)((long)plVar12 + 1) == 'E');
      auVar16[2] = -(*(char *)((long)plVar12 + 2) == 'K');
      auVar16[3] = -(*(char *)((long)plVar12 + 3) == '-');
      auVar16[4] = -(*(char *)((long)plVar12 + 4) == 'I');
      auVar16[5] = -(*(char *)((long)plVar12 + 5) == 'n');
      auVar16[6] = -(*(char *)((long)plVar12 + 6) == 'f');
      auVar16[7] = -(*(char *)((long)plVar12 + 7) == 'o');
      auVar16[8] = -((char)plVar12[1] == ':');
      auVar16[9] = -(*(char *)((long)plVar12 + 9) == ' ');
      auVar16[10] = -(*(char *)((long)plVar12 + 10) == 'A');
      auVar16[0xb] = -(*(char *)((long)plVar12 + 0xb) == 'E');
      auVar16[0xc] = -(*(char *)((long)plVar12 + 0xc) == 'S');
      auVar16[0xd] = -(*(char *)((long)plVar12 + 0xd) == '-');
      auVar16[0xe] = -(*(char *)((long)plVar12 + 0xe) == '1');
      auVar16[0xf] = -(*(char *)((long)plVar12 + 0xf) == '2');
      auVar16 = auVar16 & auVar22;
      if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
        uVar10 = 5;
      }
      else {
        auVar23[0] = -(*(char *)((long)plVar12 + 6) == 'f');
        auVar23[1] = -(*(char *)((long)plVar12 + 7) == 'o');
        auVar23[2] = -((char)plVar12[1] == ':');
        auVar23[3] = -(*(char *)((long)plVar12 + 9) == ' ');
        auVar23[4] = -(*(char *)((long)plVar12 + 10) == 'A');
        auVar23[5] = -(*(char *)((long)plVar12 + 0xb) == 'E');
        auVar23[6] = -(*(char *)((long)plVar12 + 0xc) == 'S');
        auVar23[7] = -(*(char *)((long)plVar12 + 0xd) == '-');
        auVar23[8] = -(*(char *)((long)plVar12 + 0xe) == '1');
        auVar23[9] = -(*(char *)((long)plVar12 + 0xf) == '9');
        auVar23[10] = -((char)plVar12[2] == '2');
        auVar23[0xb] = -(*(char *)((long)plVar12 + 0x11) == '-');
        auVar23[0xc] = -(*(char *)((long)plVar12 + 0x12) == 'C');
        auVar23[0xd] = -(*(char *)((long)plVar12 + 0x13) == 'B');
        auVar23[0xe] = -(*(char *)((long)plVar12 + 0x14) == 'C');
        auVar23[0xf] = -(*(char *)((long)plVar12 + 0x15) == ',');
        auVar17[0] = -((char)*plVar12 == 'D');
        auVar17[1] = -(*(char *)((long)plVar12 + 1) == 'E');
        auVar17[2] = -(*(char *)((long)plVar12 + 2) == 'K');
        auVar17[3] = -(*(char *)((long)plVar12 + 3) == '-');
        auVar17[4] = -(*(char *)((long)plVar12 + 4) == 'I');
        auVar17[5] = -(*(char *)((long)plVar12 + 5) == 'n');
        auVar17[6] = -(*(char *)((long)plVar12 + 6) == 'f');
        auVar17[7] = -(*(char *)((long)plVar12 + 7) == 'o');
        auVar17[8] = -((char)plVar12[1] == ':');
        auVar17[9] = -(*(char *)((long)plVar12 + 9) == ' ');
        auVar17[10] = -(*(char *)((long)plVar12 + 10) == 'A');
        auVar17[0xb] = -(*(char *)((long)plVar12 + 0xb) == 'E');
        auVar17[0xc] = -(*(char *)((long)plVar12 + 0xc) == 'S');
        auVar17[0xd] = -(*(char *)((long)plVar12 + 0xd) == '-');
        auVar17[0xe] = -(*(char *)((long)plVar12 + 0xe) == '1');
        auVar17[0xf] = -(*(char *)((long)plVar12 + 0xf) == '9');
        auVar17 = auVar17 & auVar23;
        if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) {
          uVar10 = 6;
        }
        else {
          auVar24[0] = -(*(char *)((long)plVar12 + 6) == 'f');
          auVar24[1] = -(*(char *)((long)plVar12 + 7) == 'o');
          auVar24[2] = -((char)plVar12[1] == ':');
          auVar24[3] = -(*(char *)((long)plVar12 + 9) == ' ');
          auVar24[4] = -(*(char *)((long)plVar12 + 10) == 'A');
          auVar24[5] = -(*(char *)((long)plVar12 + 0xb) == 'E');
          auVar24[6] = -(*(char *)((long)plVar12 + 0xc) == 'S');
          auVar24[7] = -(*(char *)((long)plVar12 + 0xd) == '-');
          auVar24[8] = -(*(char *)((long)plVar12 + 0xe) == '2');
          auVar24[9] = -(*(char *)((long)plVar12 + 0xf) == '5');
          auVar24[10] = -((char)plVar12[2] == '6');
          auVar24[0xb] = -(*(char *)((long)plVar12 + 0x11) == '-');
          auVar24[0xc] = -(*(char *)((long)plVar12 + 0x12) == 'C');
          auVar24[0xd] = -(*(char *)((long)plVar12 + 0x13) == 'B');
          auVar24[0xe] = -(*(char *)((long)plVar12 + 0x14) == 'C');
          auVar24[0xf] = -(*(char *)((long)plVar12 + 0x15) == ',');
          auVar18[0] = -((char)*plVar12 == 'D');
          auVar18[1] = -(*(char *)((long)plVar12 + 1) == 'E');
          auVar18[2] = -(*(char *)((long)plVar12 + 2) == 'K');
          auVar18[3] = -(*(char *)((long)plVar12 + 3) == '-');
          auVar18[4] = -(*(char *)((long)plVar12 + 4) == 'I');
          auVar18[5] = -(*(char *)((long)plVar12 + 5) == 'n');
          auVar18[6] = -(*(char *)((long)plVar12 + 6) == 'f');
          auVar18[7] = -(*(char *)((long)plVar12 + 7) == 'o');
          auVar18[8] = -((char)plVar12[1] == ':');
          auVar18[9] = -(*(char *)((long)plVar12 + 9) == ' ');
          auVar18[10] = -(*(char *)((long)plVar12 + 10) == 'A');
          auVar18[0xb] = -(*(char *)((long)plVar12 + 0xb) == 'E');
          auVar18[0xc] = -(*(char *)((long)plVar12 + 0xc) == 'S');
          auVar18[0xd] = -(*(char *)((long)plVar12 + 0xd) == '-');
          auVar18[0xe] = -(*(char *)((long)plVar12 + 0xe) == '2');
          auVar18[0xf] = -(*(char *)((long)plVar12 + 0xf) == '5');
          auVar18 = auVar18 & auVar24;
          if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) {
            return -0x1280;
          }
          uVar10 = 7;
        }
      }
      if ((long)puVar6 - ((long)plVar12 + 0x16) < 0x20) {
        return -0x1200;
      }
      iVar4 = pem_get_iv((uchar *)((long)plVar12 + 0x16),local_58,0x10);
      if (iVar4 != 0) {
        return -0x1200;
      }
      plVar12 = (long *)((long)plVar12 + 0x36);
    }
    uVar9 = (ulong)((char)*plVar12 == '\r');
    if (*(char *)((long)plVar12 + uVar9) != '\n') {
      return -0x1100;
    }
    puVar11 = (uchar *)((long)plVar12 + uVar9 + 1);
    bVar1 = false;
  }
  if (puVar6 <= puVar11) {
    return -0x1100;
  }
  iVar4 = mbedtls_base64_decode((uchar *)0x0,0,&local_60,puVar11,(long)puVar6 - (long)puVar11);
  sVar7 = local_60;
  if (iVar4 == -0x2c) {
    return -0x112c;
  }
  puVar5 = (uchar *)calloc(1,local_60);
  if (puVar5 == (uchar *)0x0) {
    return -0x1180;
  }
  iVar4 = mbedtls_base64_decode(puVar5,sVar7,&local_60,puVar11,(long)puVar6 - (long)puVar11);
  if (iVar4 != 0) {
    if (local_60 != 0) {
      sVar8 = 0;
      do {
        puVar5[sVar8] = '\0';
        sVar8 = sVar8 + 1;
      } while (local_60 != sVar8);
    }
    free(puVar5);
    return iVar4 + -0x1100;
  }
  if (bVar1) {
LAB_00115ef0:
    ctx->buf = puVar5;
    ctx->buflen = local_60;
    iVar4 = 0;
  }
  else {
    if (local_38 == (uchar *)0x0) {
      if (local_60 != 0) {
        sVar8 = 0;
        do {
          puVar5[sVar8] = '\0';
          sVar8 = sVar8 + 1;
        } while (local_60 != sVar8);
      }
      free(puVar5);
      return -0x1300;
    }
    if (uVar10 < 7) {
      if (uVar10 == 5) {
        uVar10 = 0x10;
LAB_00116171:
        iVar4 = pem_aes_decrypt(local_58,uVar10,puVar5,local_60,local_38,local_40);
        goto LAB_0011617a;
      }
      if (uVar10 == 6) {
        uVar10 = 0x18;
        goto LAB_00116171;
      }
    }
    else {
      if (uVar10 == 7) {
        uVar10 = 0x20;
        goto LAB_00116171;
      }
      if (uVar10 == 0x21) {
        iVar4 = pem_des_decrypt(local_58,puVar5,local_60,local_38,local_40);
      }
      else {
        if (uVar10 != 0x25) goto LAB_0011618e;
        iVar4 = pem_des3_decrypt(local_58,puVar5,local_60,local_38,local_40);
      }
LAB_0011617a:
      if (iVar4 != 0) {
        free(puVar5);
        return iVar4;
      }
    }
LAB_0011618e:
    if (local_60 < 3) {
      if (local_60 != 0) goto LAB_001161b7;
    }
    else {
      if ((*puVar5 == '0') && (puVar5[1] < 0x84)) goto LAB_00115ef0;
LAB_001161b7:
      uVar9 = 0;
      do {
        puVar5[uVar9] = '\0';
        uVar9 = uVar9 + 1;
      } while (local_60 != uVar9);
    }
    free(puVar5);
    iVar4 = -0x1380;
  }
  return iVar4;
}

Assistant:

int mbedtls_pem_read_buffer( mbedtls_pem_context *ctx, const char *header, const char *footer,
                     const unsigned char *data, const unsigned char *pwd,
                     size_t pwdlen, size_t *use_len )
{
    int ret, enc;
    size_t len;
    unsigned char *buf;
    const unsigned char *s1, *s2, *end;
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
    unsigned char pem_iv[16];
    mbedtls_cipher_type_t enc_alg = MBEDTLS_CIPHER_NONE;
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */

    if( ctx == NULL )
        return( MBEDTLS_ERR_PEM_BAD_INPUT_DATA );

    s1 = (unsigned char *) strstr( (const char *) data, header );

    if( s1 == NULL )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s2 = (unsigned char *) strstr( (const char *) data, footer );

    if( s2 == NULL || s2 <= s1 )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s1 += strlen( header );
    if( *s1 == ' '  ) s1++;
    if( *s1 == '\r' ) s1++;
    if( *s1 == '\n' ) s1++;
    else return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    end = s2;
    end += strlen( footer );
    if( *end == ' '  ) end++;
    if( *end == '\r' ) end++;
    if( *end == '\n' ) end++;
    *use_len = end - data;

    enc = 0;

    if( s2 - s1 >= 22 && memcmp( s1, "Proc-Type: 4,ENCRYPTED", 22 ) == 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        enc++;

        s1 += 22;
        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );


#if defined(MBEDTLS_DES_C)
        if( s2 - s1 >= 23 && memcmp( s1, "DEK-Info: DES-EDE3-CBC,", 23 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_EDE3_CBC;

            s1 += 23;
            if( s2 - s1 < 16 || pem_get_iv( s1, pem_iv, 8 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
        else if( s2 - s1 >= 18 && memcmp( s1, "DEK-Info: DES-CBC,", 18 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_CBC;

            s1 += 18;
            if( s2 - s1 < 16 || pem_get_iv( s1, pem_iv, 8) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( s2 - s1 >= 14 && memcmp( s1, "DEK-Info: AES-", 14 ) == 0 )
        {
            if( s2 - s1 < 22 )
                return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );
            else if( memcmp( s1, "DEK-Info: AES-128-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_128_CBC;
            else if( memcmp( s1, "DEK-Info: AES-192-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_192_CBC;
            else if( memcmp( s1, "DEK-Info: AES-256-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_256_CBC;
            else
                return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

            s1 += 22;
            if( s2 - s1 < 32 || pem_get_iv( s1, pem_iv, 16 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 32;
        }
#endif /* MBEDTLS_AES_C */

        if( enc_alg == MBEDTLS_CIPHER_NONE )
            return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );
#else
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    if( s1 >= s2 )
        return( MBEDTLS_ERR_PEM_INVALID_DATA );

    ret = mbedtls_base64_decode( NULL, 0, &len, s1, s2 - s1 );

    if( ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER )
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );

    if( ( buf = mbedtls_calloc( 1, len ) ) == NULL )
        return( MBEDTLS_ERR_PEM_ALLOC_FAILED );

    if( ( ret = mbedtls_base64_decode( buf, len, &len, s1, s2 - s1 ) ) != 0 )
    {
        mbedtls_zeroize( buf, len );
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );
    }

    if( enc != 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        if( pwd == NULL )
        {
            mbedtls_zeroize( buf, len );
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_REQUIRED );
        }

        ret = 0;

#if defined(MBEDTLS_DES_C)
        if( enc_alg == MBEDTLS_CIPHER_DES_EDE3_CBC )
            ret = pem_des3_decrypt( pem_iv, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_DES_CBC )
            ret = pem_des_decrypt( pem_iv, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( enc_alg == MBEDTLS_CIPHER_AES_128_CBC )
            ret = pem_aes_decrypt( pem_iv, 16, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_192_CBC )
            ret = pem_aes_decrypt( pem_iv, 24, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_256_CBC )
            ret = pem_aes_decrypt( pem_iv, 32, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_AES_C */

        if( ret != 0 )
        {
            mbedtls_free( buf );
            return( ret );
        }

        /*
         * The result will be ASN.1 starting with a SEQUENCE tag, with 1 to 3
         * length bytes (allow 4 to be sure) in all known use cases.
         *
         * Use that as a heuristic to try to detect password mismatches.
         */
        if( len <= 2 || buf[0] != 0x30 || buf[1] > 0x83 )
        {
            mbedtls_zeroize( buf, len );
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_MISMATCH );
        }
#else
        mbedtls_zeroize( buf, len );
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    ctx->buf = buf;
    ctx->buflen = len;

    return( 0 );
}